

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCollapsibleFrame.cpp
# Opt level: O1

QSize __thiscall QCollapsibleFrame::minimumSizeHint(QCollapsibleFrame *this)

{
  QCollapsibleFramePrivate *pQVar1;
  Data *pDVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint uVar6;
  undefined8 uVar7;
  long *plVar8;
  int extraout_var;
  uint uVar9;
  uint uVar11;
  undefined1 auVar12 [16];
  ulong uVar10;
  
  auVar12 = QLayout::contentsMargins();
  uVar7 = (**(code **)(*(long *)this->d->button + 0x78))();
  uVar11 = (int)uVar7 + auVar12._8_4_ + auVar12._0_4_;
  uVar9 = auVar12._12_4_ + auVar12._4_4_ + (int)((ulong)uVar7 >> 0x20);
  uVar10 = (ulong)uVar9;
  pQVar1 = this->d;
  if ((((pQVar1->collapsed == false) && (pDVar2 = (pQVar1->widget).wp.d, pDVar2 != (Data *)0x0)) &&
      (*(int *)(pDVar2 + 4) != 0)) && ((pQVar1->widget).wp.value != (QObject *)0x0)) {
    iVar3 = (**(code **)(*(long *)pQVar1->verticalLayout + 0x60))();
    if (iVar3 == -1) {
      plVar8 = (long *)QWidget::style();
      iVar3 = (**(code **)(*plVar8 + 0xe0))(plVar8,0x50,0,0);
    }
    if (iVar3 == -1) {
      plVar8 = (long *)QWidget::style();
      QWidget::sizePolicy();
      uVar4 = QSizePolicy::controlType();
      QWidget::sizePolicy();
      uVar5 = QSizePolicy::controlType();
      iVar3 = (**(code **)(*plVar8 + 0x110))(plVar8,uVar4,uVar5,2,0,this);
    }
    uVar6 = (**(code **)(*(long *)(this->d->widget).wp.value + 0x78))();
    if ((int)uVar6 < (int)uVar11) {
      uVar6 = uVar11;
    }
    uVar11 = uVar6;
    (**(code **)(*(long *)(this->d->widget).wp.value + 0x78))();
    uVar10 = (ulong)(extraout_var + iVar3 + uVar9);
  }
  return (QSize)((ulong)uVar11 | uVar10 << 0x20);
}

Assistant:

QSize QCollapsibleFrame::minimumSizeHint() const {
    const QMargins margins = d->verticalLayout->contentsMargins();
    QSize sh(d->button->minimumSizeHint());

    sh.rwidth() += margins.left() + margins.right();
    sh.rheight() += margins.top() + margins.bottom();

    if (d->collapsed) {
    } else if (d->widget) {
        int spacing = d->verticalLayout->spacing();

        if (spacing == -1) {
            spacing = style()->pixelMetric(QStyle::PM_LayoutVerticalSpacing);
        }

        if (spacing == -1) {
            spacing = style()->layoutSpacing(d->button->sizePolicy().controlType(),
                                             d->widget->sizePolicy().controlType(), Qt::Vertical, nullptr, this);
        }

        sh.rwidth() = qMax(sh.width(), d->widget->minimumSizeHint().width());
        sh.rheight() += d->widget->minimumSizeHint().height();
        sh.rheight() += spacing;
    }

    return sh;
}